

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManSolve2(Cbs2_Man_t *p,int iLit,int iLit2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x587,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x588,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x589,"int Cbs2_ManSolve2(Cbs2_Man_t *, int, int)");
  }
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  (p->Pars).nBTThisNc = 0;
  Cbs2_ManAssign(p,iLit,0,0,0);
  if (iLit2 != 0) {
    Cbs2_ManAssign(p,iLit2,0,0,0);
  }
  iVar7 = Cbs2_ManSolve_rec(p,0);
  iVar10 = 1;
  if (iVar7 == 0) {
    iVar7 = (p->Pars).nBTThis;
    bVar5 = (p->Pars).nJustLimit < (p->Pars).nJustThis;
    p->nFails[0] = p->nFails[0] + (uint)bVar5;
    bVar6 = (p->Pars).nBTLimit < iVar7;
    p->nFails[1] = p->nFails[1] + (uint)bVar6;
    if (!bVar6 && !bVar5) {
      p_00 = p->vModel;
      iVar10 = 0;
      p_00->nSize = 0;
      (p->pProp).iHead = 0;
      if (0 < (p->pProp).iTail) {
        iVar10 = 0;
        lVar9 = 0;
        do {
          uVar2 = (p->pProp).pData[lVar9];
          if (uVar2 == 0) break;
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if ((p->vAssign).nSize <= (int)(uVar2 >> 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          Vec_IntPush(p_00,uVar2 & 0x7ffffffe | (uint)((p->vAssign).pArray[uVar2 >> 1] == '\0'));
          lVar9 = lVar9 + 1;
        } while (lVar9 < (p->pProp).iTail);
      }
    }
  }
  Cbs2_ManCancelUntil(p,0);
  if (0 < (p->vWatchUpds).nSize) {
    piVar4 = (p->vWatchUpds).pArray;
    lVar9 = 0;
    do {
      iVar7 = piVar4[lVar9];
      if (((long)iVar7 < 0) || ((p->vWatches).nSize <= iVar7)) goto LAB_00717bc2;
      (p->vWatches).pArray[iVar7] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vWatchUpds).nSize);
  }
  (p->vWatchUpds).nSize = 0;
  if (0 < (p->vActStore).nSize) {
    piVar4 = (p->vActStore).pArray;
    lVar9 = 0;
    do {
      iVar7 = piVar4[lVar9];
      if (((long)iVar7 < 0) || ((p->vActivity).nSize <= iVar7)) {
LAB_00717bc2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vActivity).pArray[iVar7] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vActStore).nSize);
  }
  (p->pJust).iHead = 0;
  (p->pJust).iTail = 0;
  (p->pClauses).iHead = 1;
  (p->pClauses).iTail = 1;
  iVar7 = (p->Pars).nBTThis;
  iVar3 = (p->Pars).nJustThis;
  piVar4 = &(p->Pars).nBTTotal;
  *piVar4 = *piVar4 + iVar7;
  iVar8 = (p->Pars).nJustTotal;
  if (iVar8 <= iVar3) {
    iVar8 = iVar3;
  }
  (p->Pars).nJustTotal = iVar8;
  iVar8 = (p->Pars).nBTLimit;
  if (iVar8 < iVar7) {
    iVar10 = -1;
  }
  iVar1 = (p->Pars).nJustLimit;
  if (iVar1 < iVar3) {
    iVar10 = -1;
  }
  p->nFails[0] = p->nFails[0] + (uint)(iVar1 < iVar3);
  p->nFails[1] = p->nFails[1] + (uint)(iVar8 < iVar7);
  return iVar10;
}

Assistant:

int Cbs2_ManSolve2( Cbs2_Man_t * p, int iLit, int iLit2 )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( iLit2 ) 
    Cbs2_ManAssign( p, iLit2, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModelAll( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}